

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O0

void mbedtls_mpi_core_exp_mod
               (mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,mbedtls_mpi_uint *N,size_t AN_limbs,
               mbedtls_mpi_uint *E,size_t E_limbs,mbedtls_mpi_uint *RR,mbedtls_mpi_uint *T)

{
  size_t sVar1;
  size_t welem_00;
  mbedtls_mpi_uint *dest;
  mbedtls_mpi_uint *temp_00;
  mbedtls_mpi_uint mm_00;
  ulong local_98;
  mbedtls_mpi_uint window;
  size_t window_bits;
  size_t E_bit_index;
  size_t E_limb_index;
  mbedtls_mpi_uint mm;
  mbedtls_mpi_uint *temp;
  mbedtls_mpi_uint *Wselect;
  mbedtls_mpi_uint *Wtable;
  size_t select_limbs;
  size_t table_limbs;
  size_t welem;
  size_t wsize;
  size_t E_limbs_local;
  mbedtls_mpi_uint *E_local;
  size_t AN_limbs_local;
  mbedtls_mpi_uint *N_local;
  mbedtls_mpi_uint *A_local;
  mbedtls_mpi_uint *X_local;
  
  sVar1 = exp_mod_get_window_size(E_limbs << 6);
  welem_00 = 1L << ((byte)sVar1 & 0x3f);
  dest = T + welem_00 * AN_limbs;
  temp_00 = dest + AN_limbs;
  mm_00 = mbedtls_mpi_core_montmul_init(N);
  exp_mod_precompute_window(A,N,AN_limbs,mm_00,RR,welem_00,T,temp_00);
  memcpy(X,T,AN_limbs << 3);
  window_bits = 0;
  window = 0;
  local_98 = 0;
  E_bit_index = E_limbs;
  do {
    mbedtls_mpi_core_montmul(X,X,X,AN_limbs,N,AN_limbs,mm_00,temp_00);
    if (window_bits == 0) {
      E_bit_index = E_bit_index - 1;
      window_bits = 0x3f;
    }
    else {
      window_bits = window_bits - 1;
    }
    window = window + 1;
    local_98 = E[E_bit_index] >> ((byte)window_bits & 0x3f) & 1 | local_98 << 1;
    if ((window == sVar1) || ((window_bits == 0 && (E_bit_index == 0)))) {
      mbedtls_mpi_core_ct_uint_table_lookup(dest,T,AN_limbs,welem_00,local_98);
      mbedtls_mpi_core_montmul(X,X,dest,AN_limbs,N,AN_limbs,mm_00,temp_00);
      local_98 = 0;
      window = 0;
    }
  } while (window_bits != 0 || E_bit_index != 0);
  return;
}

Assistant:

void mbedtls_mpi_core_exp_mod(mbedtls_mpi_uint *X,
                              const mbedtls_mpi_uint *A,
                              const mbedtls_mpi_uint *N,
                              size_t AN_limbs,
                              const mbedtls_mpi_uint *E,
                              size_t E_limbs,
                              const mbedtls_mpi_uint *RR,
                              mbedtls_mpi_uint *T)
{
    const size_t wsize = exp_mod_get_window_size(E_limbs * biL);
    const size_t welem = ((size_t) 1) << wsize;

    /* This is how we will use the temporary storage T, which must have space
     * for table_limbs, select_limbs and (2 * AN_limbs + 1) for montmul. */
    const size_t table_limbs  = welem * AN_limbs;
    const size_t select_limbs = AN_limbs;

    /* Pointers to specific parts of the temporary working memory pool */
    mbedtls_mpi_uint *const Wtable  = T;
    mbedtls_mpi_uint *const Wselect = Wtable  +  table_limbs;
    mbedtls_mpi_uint *const temp    = Wselect + select_limbs;

    /*
     * Window precomputation
     */

    const mbedtls_mpi_uint mm = mbedtls_mpi_core_montmul_init(N);

    /* Set Wtable[i] = A^(2^i) (in Montgomery representation) */
    exp_mod_precompute_window(A, N, AN_limbs,
                              mm, RR,
                              welem, Wtable, temp);

    /*
     * Fixed window exponentiation
     */

    /* X = 1 (in Montgomery presentation) initially */
    memcpy(X, Wtable, AN_limbs * ciL);

    /* We'll process the bits of E from most significant
     * (limb_index=E_limbs-1, E_bit_index=biL-1) to least significant
     * (limb_index=0, E_bit_index=0). */
    size_t E_limb_index = E_limbs;
    size_t E_bit_index = 0;
    /* At any given time, window contains window_bits bits from E.
     * window_bits can go up to wsize. */
    size_t window_bits = 0;
    mbedtls_mpi_uint window = 0;

    do {
        /* Square */
        mbedtls_mpi_core_montmul(X, X, X, AN_limbs, N, AN_limbs, mm, temp);

        /* Move to the next bit of the exponent */
        if (E_bit_index == 0) {
            --E_limb_index;
            E_bit_index = biL - 1;
        } else {
            --E_bit_index;
        }
        /* Insert next exponent bit into window */
        ++window_bits;
        window <<= 1;
        window |= (E[E_limb_index] >> E_bit_index) & 1;

        /* Clear window if it's full. Also clear the window at the end,
         * when we've finished processing the exponent. */
        if (window_bits == wsize ||
            (E_bit_index == 0 && E_limb_index == 0)) {
            /* Select Wtable[window] without leaking window through
             * memory access patterns. */
            mbedtls_mpi_core_ct_uint_table_lookup(Wselect, Wtable,
                                                  AN_limbs, welem, window);
            /* Multiply X by the selected element. */
            mbedtls_mpi_core_montmul(X, X, Wselect, AN_limbs, N, AN_limbs, mm,
                                     temp);
            window = 0;
            window_bits = 0;
        }
    } while (!(E_bit_index == 0 && E_limb_index == 0));
}